

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O3

uint64_t __thiscall
adios2::core::engine::BP5Writer::WriteMetadata
          (BP5Writer *this,vector<char,_std::allocator<char>_> *ContigMetaData,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *SizeVector,
          vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *AttributeBlocks)

{
  TransportMan *this_00;
  JSONProfiler *this_01;
  pointer puVar1;
  pointer puVar2;
  char *buffer;
  pointer piVar3;
  unsigned_long *__args;
  iovec *b;
  long lVar4;
  pointer piVar5;
  ulong uVar6;
  pointer puVar7;
  size_t size;
  pointer pcVar8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> AttrSizeVector;
  long local_a0;
  char *local_98;
  iterator iStack_90;
  unsigned_long *local_88;
  BP5Writer *local_80;
  unsigned_long local_78;
  string local_70;
  string local_50;
  
  puVar1 = (SizeVector->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (SizeVector->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_80 = this;
  if (puVar1 == puVar2) {
    local_98 = (char *)0x0;
    iStack_90._M_current = (unsigned_long *)0x0;
    local_88 = (unsigned_long *)0x0;
    local_a0 = (long)puVar2 - (long)puVar1;
  }
  else {
    local_a0 = 0;
    puVar7 = puVar1;
    do {
      local_a0 = local_a0 + *puVar7;
      puVar7 = puVar7 + 1;
    } while (puVar7 != puVar2);
    local_98 = (char *)0x0;
    iStack_90._M_current = (unsigned_long *)0x0;
    local_88 = (unsigned_long *)0x0;
    local_a0 = ((long)puVar2 - (long)puVar1) + local_a0;
    if ((long)puVar2 - (long)puVar1 != 0) {
      lVar4 = 8;
      uVar6 = 0;
      do {
        piVar5 = (AttributeBlocks->
                 super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        if (uVar6 < (ulong)((long)(AttributeBlocks->
                                  super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)piVar5 >> 4))
        {
          __args = (unsigned_long *)((long)&piVar5->iov_base + lVar4);
          local_a0 = *(long *)((long)&piVar5->iov_base + lVar4) + local_a0 + 8;
          if (iStack_90._M_current == local_88) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_98,iStack_90,
                       __args);
          }
          else {
            *iStack_90._M_current = *__args;
            iStack_90._M_current = iStack_90._M_current + 1;
          }
        }
        else {
          local_78 = 0;
          if (iStack_90._M_current == local_88) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_98,iStack_90,
                       &local_78);
          }
          else {
            *iStack_90._M_current = 0;
            iStack_90._M_current = iStack_90._M_current + 1;
          }
          local_a0 = local_a0 + 8;
        }
        uVar6 = uVar6 + 1;
        lVar4 = lVar4 + 0x10;
      } while (uVar6 < (ulong)((long)(SizeVector->
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(SizeVector->
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     )._M_impl.super__Vector_impl_data._M_start >> 3));
    }
  }
  this_00 = &local_80->m_FileMetadataManager;
  transportman::TransportMan::WriteFiles(this_00,(char *)&local_a0,8,-1);
  puVar1 = (SizeVector->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  transportman::TransportMan::WriteFiles
            (this_00,(char *)puVar1,
             (long)(SizeVector->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar1,-1);
  size = (long)iStack_90._M_current - (long)local_98;
  transportman::TransportMan::WriteFiles(this_00,local_98,size,-1);
  uVar6 = (long)iStack_90._M_current + (size - (long)local_98);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"MetadataBlockWrite","");
  this_01 = &local_80->m_Profiler;
  profiling::JSONProfiler::Start(this_01,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  buffer = (ContigMetaData->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  transportman::TransportMan::WriteFiles
            (this_00,buffer,
             (long)(ContigMetaData->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)buffer,-1);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"MetadataBlockWrite","");
  profiling::JSONProfiler::Stop(this_01,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pcVar8 = (ContigMetaData->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
           super__Vector_impl_data._M_finish +
           ((uVar6 & 0xfffffffffffffff8) -
           (long)(ContigMetaData->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start) + 8;
  piVar3 = (AttributeBlocks->
           super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar5 = (AttributeBlocks->
                super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>).
                _M_impl.super__Vector_impl_data._M_start; piVar5 != piVar3; piVar5 = piVar5 + 1) {
    if ((char *)piVar5->iov_base != (char *)0x0) {
      transportman::TransportMan::WriteFiles(this_00,(char *)piVar5->iov_base,piVar5->iov_len,-1);
      pcVar8 = pcVar8 + piVar5->iov_len;
    }
  }
  transportman::TransportMan::FlushFiles(this_00,-1);
  local_80->m_MetaDataPos = (uint64_t)(pcVar8 + local_80->m_MetaDataPos);
  if (local_98 != (char *)0x0) {
    operator_delete(local_98);
  }
  return (uint64_t)pcVar8;
}

Assistant:

uint64_t BP5Writer::WriteMetadata(const std::vector<char> &ContigMetaData,
                                  const std::vector<size_t> &SizeVector,
                                  const std::vector<core::iovec> &AttributeBlocks)
{
    size_t MDataTotalSize = std::accumulate(SizeVector.begin(), SizeVector.end(), size_t(0));
    uint64_t MetaDataSize = 0;
    std::vector<uint64_t> AttrSizeVector;

    MDataTotalSize += SizeVector.size() * sizeof(size_t);
    for (size_t a = 0; a < SizeVector.size(); a++)
    {
        if (a < AttributeBlocks.size())
        {
            auto &b = AttributeBlocks[a];
            MDataTotalSize += sizeof(uint64_t) + b.iov_len;
            AttrSizeVector.push_back(b.iov_len);
        }
        else
        {
            AttrSizeVector.push_back(0);
            MDataTotalSize += sizeof(uint64_t);
        }
    }
    MetaDataSize = 0;
    m_FileMetadataManager.WriteFiles((char *)&MDataTotalSize, sizeof(uint64_t));
    MetaDataSize += sizeof(uint64_t);
    m_FileMetadataManager.WriteFiles((char *)SizeVector.data(),
                                     sizeof(uint64_t) * SizeVector.size());
    MetaDataSize += sizeof(uint64_t) * AttrSizeVector.size();
    m_FileMetadataManager.WriteFiles((char *)AttrSizeVector.data(),
                                     sizeof(uint64_t) * AttrSizeVector.size());
    MetaDataSize += sizeof(uint64_t) * AttrSizeVector.size();
    m_Profiler.Start("MetadataBlockWrite");
    m_FileMetadataManager.WriteFiles(ContigMetaData.data(), ContigMetaData.size());
    m_Profiler.Stop("MetadataBlockWrite");
    MetaDataSize += ContigMetaData.size();

    for (auto &b : AttributeBlocks)
    {
        if (!b.iov_base)
            continue;
        m_FileMetadataManager.WriteFiles((char *)b.iov_base, b.iov_len);
        MetaDataSize += b.iov_len;
    }

    m_FileMetadataManager.FlushFiles();

    m_MetaDataPos += MetaDataSize;
    return MetaDataSize;
}